

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-server.c
# Opt level: O0

int lws_tls_server_client_cert_verify_config(lws_vhost *vh)

{
  int local_1c;
  int verify_options;
  lws_vhost *vh_local;
  
  local_1c = 1;
  if ((vh->options & 0x1002) == 0x1002) {
    if ((vh->options & 0x80) != 0x80) {
      local_1c = 3;
    }
    SSL_CTX_set_session_id_context((SSL_CTX *)(vh->tls).ssl_ctx,(uchar *)vh->context,8);
    SSL_CTX_set_verify((SSL_CTX *)(vh->tls).ssl_ctx,local_1c,OpenSSL_verify_callback);
  }
  return 0;
}

Assistant:

int
lws_tls_server_client_cert_verify_config(struct lws_vhost *vh)
{
	int verify_options = SSL_VERIFY_PEER;

	/* as a server, are we requiring clients to identify themselves? */

	if (!lws_check_opt(vh->options,
			  LWS_SERVER_OPTION_REQUIRE_VALID_OPENSSL_CLIENT_CERT))
		return 0;

	if (!lws_check_opt(vh->options,
			   LWS_SERVER_OPTION_PEER_CERT_NOT_REQUIRED))
		verify_options |= SSL_VERIFY_FAIL_IF_NO_PEER_CERT;

	SSL_CTX_set_session_id_context(vh->tls.ssl_ctx, (uint8_t *)vh->context,
				       sizeof(void *));

	/* absolutely require the client cert */
	SSL_CTX_set_verify(vh->tls.ssl_ctx, verify_options,
			   OpenSSL_verify_callback);

	return 0;
}